

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picobench.hpp
# Opt level: O1

void __thiscall picobench::runner::run_benchmarks(runner *this,int random_seed)

{
  iterator *piVar1;
  benchmark_impl *pbVar2;
  pointer psVar3;
  ostream *poVar4;
  char *pcVar5;
  long lVar6;
  size_t sVar7;
  pointer puVar8;
  pthread_t __th;
  ulong uVar9;
  ulong uVar10;
  vector<picobench::benchmark_impl_*,_std::allocator<picobench::benchmark_impl_*>_> *__range2;
  unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_> *rb;
  pointer puVar11;
  pointer piVar12;
  uint uVar13;
  unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_> *b;
  int iVar14;
  rsuite *suite;
  pointer prVar15;
  vector<int,_std::allocator<int>_> *pvVar16;
  vector<picobench::benchmark_impl_*,_std::allocator<picobench::benchmark_impl_*>_> benchmarks;
  int iters;
  pointer local_13f8;
  iterator iStack_13f0;
  benchmark_impl **local_13e8;
  pointer local_13e0;
  pointer local_13d8;
  pointer local_13d0;
  runner *local_13c8;
  vector<int,_std::allocator<int>_> *local_13c0;
  anon_union_5000_2_650ea050_for_random_device_0 local_13b8;
  
  if (random_seed == -1) {
    std::random_device::random_device((random_device *)&local_13b8.field_0);
    random_seed = std::random_device::_M_getval();
    std::random_device::_M_fini();
  }
  uVar10 = (ulong)(long)random_seed % 0x7fffffff +
           (ulong)((ulong)(long)random_seed % 0x7fffffff == 0);
  local_13f8 = (pointer)0x0;
  iStack_13f0._M_current = (benchmark_impl **)0x0;
  local_13e8 = (benchmark_impl **)0x0;
  prVar15 = (this->super_registry)._suites.
            super__Vector_base<picobench::rsuite,_std::allocator<picobench::rsuite>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_13e0 = (this->super_registry)._suites.
               super__Vector_base<picobench::rsuite,_std::allocator<picobench::rsuite>_>._M_impl.
               super__Vector_impl_data._M_finish;
  local_13c8 = this;
  if (prVar15 != local_13e0) {
    do {
      puVar11 = (prVar15->benchmarks).
                super__Vector_base<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>,_std::allocator<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar8 = (prVar15->benchmarks).
               super__Vector_base<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>,_std::allocator<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      uVar9 = 0;
      if (puVar11 != puVar8) {
        do {
          pbVar2 = (puVar11->_M_t).
                   super___uniq_ptr_impl<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_picobench::benchmark_impl_*,_std::default_delete<picobench::benchmark_impl>_>
                   .super__Head_base<0UL,_picobench::benchmark_impl_*,_false>._M_head_impl;
          psVar3 = *(pointer *)
                    &(pbVar2->_states).
                     super__Vector_base<picobench::state,_std::allocator<picobench::state>_>._M_impl
          ;
          if (*(pointer *)
               ((long)&(pbVar2->_states).
                       super__Vector_base<picobench::state,_std::allocator<picobench::state>_> + 8)
              != psVar3) {
            *(pointer *)
             ((long)&(pbVar2->_states).
                     super__Vector_base<picobench::state,_std::allocator<picobench::state>_> + 8) =
                 psVar3;
          }
          local_13b8.field_0._M_file =
               (puVar11->_M_t).
               super___uniq_ptr_impl<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>
               ._M_t.
               super__Tuple_impl<0UL,_picobench::benchmark_impl_*,_std::default_delete<picobench::benchmark_impl>_>
               .super__Head_base<0UL,_picobench::benchmark_impl_*,_false>._M_head_impl;
          if (iStack_13f0._M_current == local_13e8) {
            std::vector<picobench::benchmark_impl*,std::allocator<picobench::benchmark_impl*>>::
            _M_realloc_insert<picobench::benchmark_impl*>
                      ((vector<picobench::benchmark_impl*,std::allocator<picobench::benchmark_impl*>>
                        *)&local_13f8,iStack_13f0,(benchmark_impl **)&local_13b8);
          }
          else {
            *iStack_13f0._M_current = (benchmark_impl *)local_13b8.field_0._M_file;
            iStack_13f0._M_current = iStack_13f0._M_current + 1;
          }
          uVar13 = (uint)uVar9 & 0xff;
          if ((((puVar11->_M_t).
                super___uniq_ptr_impl<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>
                ._M_t.
                super__Tuple_impl<0UL,_picobench::benchmark_impl_*,_std::default_delete<picobench::benchmark_impl>_>
                .super__Head_base<0UL,_picobench::benchmark_impl_*,_false>._M_head_impl)->
              super_benchmark)._baseline != false) {
            uVar13 = 1;
          }
          local_13d0 = (pointer)CONCAT44(local_13d0._4_4_,uVar13);
          puVar8 = puVar11 + 1;
          local_13d8 = puVar8;
          if (puVar8 != (prVar15->benchmarks).
                        super__Vector_base<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>,_std::allocator<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish) {
            do {
              if ((((puVar11->_M_t).
                    super___uniq_ptr_impl<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_picobench::benchmark_impl_*,_std::default_delete<picobench::benchmark_impl>_>
                    .super__Head_base<0UL,_picobench::benchmark_impl_*,_false>._M_head_impl)->
                  super_benchmark)._proc ==
                  (((puVar8->_M_t).
                    super___uniq_ptr_impl<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_picobench::benchmark_impl_*,_std::default_delete<picobench::benchmark_impl>_>
                    .super__Head_base<0UL,_picobench::benchmark_impl_*,_false>._M_head_impl)->
                  super_benchmark)._proc) {
                poVar4 = local_13c8->_stdwarn;
                std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Warning: ",9);
                pcVar5 = (((puVar11->_M_t).
                           super___uniq_ptr_impl<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_picobench::benchmark_impl_*,_std::default_delete<picobench::benchmark_impl>_>
                           .super__Head_base<0UL,_picobench::benchmark_impl_*,_false>._M_head_impl)
                         ->super_benchmark)._name;
                if (pcVar5 == (char *)0x0) {
                  std::ios::clear((int)poVar4 + (int)poVar4->_vptr_basic_ostream[-3]);
                }
                else {
                  sVar7 = strlen(pcVar5);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar5,sVar7);
                }
                std::__ostream_insert<char,std::char_traits<char>>(poVar4," and ",5);
                pcVar5 = (((puVar8->_M_t).
                           super___uniq_ptr_impl<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_picobench::benchmark_impl_*,_std::default_delete<picobench::benchmark_impl>_>
                           .super__Head_base<0UL,_picobench::benchmark_impl_*,_false>._M_head_impl)
                         ->super_benchmark)._name;
                if (pcVar5 == (char *)0x0) {
                  std::ios::clear((int)poVar4 + (int)poVar4->_vptr_basic_ostream[-3]);
                }
                else {
                  sVar7 = strlen(pcVar5);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar5,sVar7);
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar4," are benchmarks of the same function.\n",0x26);
              }
              puVar8 = puVar8 + 1;
            } while (puVar8 != (prVar15->benchmarks).
                               super__Vector_base<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>,_std::allocator<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish);
          }
          puVar8 = (prVar15->benchmarks).
                   super__Vector_base<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>,_std::allocator<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          uVar9 = (ulong)local_13d0 & 0xffffffff;
          puVar11 = local_13d8;
        } while (local_13d8 != puVar8);
      }
      if (((uVar9 & 1) == 0) &&
         (puVar11 = (prVar15->benchmarks).
                    super__Vector_base<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>,_std::allocator<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start, puVar11 != puVar8)) {
        (((puVar11->_M_t).
          super___uniq_ptr_impl<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>
          ._M_t.
          super__Tuple_impl<0UL,_picobench::benchmark_impl_*,_std::default_delete<picobench::benchmark_impl>_>
          .super__Head_base<0UL,_picobench::benchmark_impl_*,_false>._M_head_impl)->super_benchmark)
        ._baseline = true;
      }
      prVar15 = prVar15 + 1;
    } while (prVar15 != local_13e0);
  }
  local_13e0 = (pointer)iStack_13f0._M_current;
  if (local_13f8 != (pointer)iStack_13f0._M_current) {
    local_13c0 = &local_13c8->_default_state_iterations;
    puVar11 = local_13f8;
    do {
      pbVar2 = (puVar11->_M_t).
               super___uniq_ptr_impl<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>
               ._M_t.
               super__Tuple_impl<0UL,_picobench::benchmark_impl_*,_std::default_delete<picobench::benchmark_impl>_>
               .super__Head_base<0UL,_picobench::benchmark_impl_*,_false>._M_head_impl;
      pvVar16 = &(pbVar2->super_benchmark)._state_iterations;
      if (*(pointer *)
           &(pbVar2->super_benchmark)._state_iterations.
            super__Vector_base<int,_std::allocator<int>_>._M_impl ==
          *(pointer *)((long)&(pbVar2->super_benchmark)._state_iterations + 8)) {
        pvVar16 = local_13c0;
      }
      if ((pbVar2->super_benchmark)._samples == 0) {
        (pbVar2->super_benchmark)._samples = local_13c8->_default_samples;
      }
      std::vector<picobench::state,_std::allocator<picobench::state>_>::reserve
                (&pbVar2->_states,
                 (long)(pbVar2->super_benchmark)._samples *
                 ((long)(pvVar16->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(pvVar16->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start >> 2));
      piVar12 = (pvVar16->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start;
      local_13d0 = (pvVar16->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
      local_13d8 = puVar11;
      if (piVar12 != local_13d0) {
        do {
          local_13b8._0_4_ = *piVar12;
          if (0 < (pbVar2->super_benchmark)._samples) {
            iVar14 = 0;
            do {
              uVar10 = (uVar10 * 0xbc8f) % 0x7fffffff;
              lVar6 = *(long *)&(pbVar2->_states).
                                super__Vector_base<picobench::state,_std::allocator<picobench::state>_>
                                ._M_impl;
              std::vector<picobench::state,std::allocator<picobench::state>>::
              _M_emplace_aux<int&,unsigned_long&>
                        ((vector<picobench::state,std::allocator<picobench::state>> *)
                         &pbVar2->_states,
                         (state *)(lVar6 + (uVar10 % (((long)*(pointer *)
                                                              ((long)&(pbVar2->_states).
                                                                                                                                            
                                                  super__Vector_base<picobench::state,_std::allocator<picobench::state>_>
                                                  + 8) - lVar6 >> 3) * -0x3333333333333333 + 1U)) *
                                           0x28),(int *)&local_13b8,
                         &(pbVar2->super_benchmark)._user_data);
              iVar14 = iVar14 + 1;
            } while (iVar14 < (pbVar2->super_benchmark)._samples);
          }
          piVar12 = piVar12 + 1;
        } while (piVar12 != local_13d0);
      }
      (pbVar2->_istate)._M_current =
           *(state **)
            &(pbVar2->_states).
             super__Vector_base<picobench::state,_std::allocator<picobench::state>_>._M_impl;
      puVar11 = local_13d8 + 1;
    } while ((pointer)puVar11 != local_13e0);
  }
  local_13b8.field_0._M_func = (_func_result_type_void_ptr *)0x0;
  local_13b8._112_8_ = 0;
  local_13b8._120_8_ = 0;
  local_13b8._96_8_ = 0;
  local_13b8._104_8_ = 0;
  local_13b8._80_8_ = 0;
  local_13b8._88_8_ = 0;
  local_13b8._64_8_ = 0;
  local_13b8._72_8_ = 0;
  local_13b8._48_8_ = 0;
  local_13b8._56_8_ = 0;
  local_13b8._32_8_ = 0;
  local_13b8._40_8_ = 0;
  local_13b8._16_8_ = 0;
  local_13b8._24_8_ = 0;
  local_13b8.field_0._M_file = (void *)0x1;
  __th = pthread_self();
  pthread_setaffinity_np(__th,0x80,(cpu_set_t *)&local_13b8.field_0);
  while( true ) {
    puVar11 = local_13f8;
    if (local_13f8 == (pointer)iStack_13f0._M_current) break;
    uVar10 = (uVar10 * 0xbc8f) % 0x7fffffff;
    uVar9 = uVar10 % (ulong)((long)iStack_13f0._M_current - (long)local_13f8 >> 3);
    pbVar2 = local_13f8[uVar9]._M_t.
             super___uniq_ptr_impl<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>
             ._M_t.
             super__Tuple_impl<0UL,_picobench::benchmark_impl_*,_std::default_delete<picobench::benchmark_impl>_>
             .super__Head_base<0UL,_picobench::benchmark_impl_*,_false>._M_head_impl;
    (*(pbVar2->super_benchmark)._proc)((pbVar2->_istate)._M_current);
    puVar11 = puVar11 + uVar9;
    piVar1 = &((puVar11->_M_t).
               super___uniq_ptr_impl<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>
               ._M_t.
               super__Tuple_impl<0UL,_picobench::benchmark_impl_*,_std::default_delete<picobench::benchmark_impl>_>
               .super__Head_base<0UL,_picobench::benchmark_impl_*,_false>._M_head_impl)->_istate;
    piVar1->_M_current = piVar1->_M_current + 1;
    pbVar2 = (puVar11->_M_t).
             super___uniq_ptr_impl<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>
             ._M_t.
             super__Tuple_impl<0UL,_picobench::benchmark_impl_*,_std::default_delete<picobench::benchmark_impl>_>
             .super__Head_base<0UL,_picobench::benchmark_impl_*,_false>._M_head_impl;
    if ((pbVar2->_istate)._M_current ==
        *(pointer *)
         ((long)&(pbVar2->_states).
                 super__Vector_base<picobench::state,_std::allocator<picobench::state>_> + 8)) {
      puVar8 = puVar11 + 1;
      if (puVar8 != (pointer)iStack_13f0._M_current) {
        memmove(puVar11,puVar8,(long)iStack_13f0._M_current - (long)puVar8);
      }
      iStack_13f0._M_current = iStack_13f0._M_current + -1;
    }
  }
  if (local_13f8 != (pointer)0x0) {
    operator_delete(local_13f8);
  }
  return;
}

Assistant:

void run_benchmarks(int random_seed = -1)
    {
        I_PICOBENCH_ASSERT(_error == no_error && _should_run);

        if (random_seed == -1)
        {
            random_seed = int(std::random_device()());
        }

        std::minstd_rand rnd(random_seed);

        // vector of all benchmarks
        std::vector<benchmark_impl*> benchmarks;
        for (auto& suite : _suites)
        {
            // also identify a baseline in this loop
            // if there is no explicit one, set the first one as a baseline
            bool found_baseline = false;
            for (auto irb = suite.benchmarks.begin(); irb != suite.benchmarks.end(); ++irb)
            {
                auto& rb = *irb;
                rb->_states.clear(); // clear states so we can safely call run_benchmarks multiple times
                benchmarks.push_back(rb.get());
                if (rb->_baseline)
                {
                    found_baseline = true;
                }

#if !defined(PICOBENCH_STD_FUNCTION_BENCHMARKS)
                // check for same func
                for (auto ib = irb+1; ib != suite.benchmarks.end(); ++ib)
                {
                    auto& b = *ib;
                    if (rb->_proc == b->_proc)
                    {
                        *_stdwarn << "Warning: " << rb->name() << " and " << b->name()
                                 << " are benchmarks of the same function.\n";
                    }
                }
#endif
            }

            if (!found_baseline && !suite.benchmarks.empty())
            {
                suite.benchmarks.front()->_baseline = true;
            }
        }

        // initialize benchmarks
        for (auto b : benchmarks)
        {
            const std::vector<int>& state_iterations =
                b->_state_iterations.empty() ?
                _default_state_iterations :
                b->_state_iterations;

            if (b->_samples == 0)
                b->_samples = _default_samples;

            b->_states.reserve(state_iterations.size() * size_t(b->_samples));

            // fill states while random shuffling them
            for (auto iters : state_iterations)
            {
                for (int i = 0; i < b->_samples; ++i)
                {
                    auto index = rnd() % (b->_states.size() + 1);
                    auto pos = b->_states.begin() + long(index);
                    b->_states.emplace(pos, iters, b->_user_data);
                }
            }

            b->_istate = b->_states.begin();
        }

#if !defined(PICOBENCH_DONT_BIND_TO_ONE_CORE)
        // set thread affinity to first cpu
        // so the high resolution clock doesn't miss cycles
        {
#if defined(_WIN32)
        SetThreadAffinityMask(GetCurrentThread(), 1);
#elif defined(__APPLE__)
        thread_affinity_policy_data_t policy = {0};
        thread_policy_set(
            pthread_mach_thread_np(pthread_self()),
            THREAD_AFFINITY_POLICY,
            (thread_policy_t)&policy, 1);
#else
        cpu_set_t cpuset;
        CPU_ZERO(&cpuset);
        CPU_SET(0, &cpuset);

        pthread_t cur = pthread_self();
        pthread_setaffinity_np(cur, sizeof(cpu_set_t), &cpuset);
#endif
        }
#endif

        // we run a random benchmark from it incrementing _istate for each
        // when _istate reaches _states.end(), we erase the benchmark
        // when the vector becomes empty, we're done
        while (!benchmarks.empty())
        {
            auto i = benchmarks.begin() + long(rnd() % benchmarks.size());
            auto& b = *i;

            b->_proc(*b->_istate);

            ++b->_istate;

            if (b->_istate == b->_states.end())
            {
                benchmarks.erase(i);
            }
        }
    }